

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O0

void secp256k1_modinv64_update_fg_62_var
               (int len,secp256k1_modinv64_signed62 *f,secp256k1_modinv64_signed62 *g,
               secp256k1_modinv64_trans2x2 *t)

{
  int64_t b;
  uint64_t uVar1;
  int64_t iVar2;
  int64_t *in_RCX;
  long in_RDX;
  int64_t *in_RSI;
  int in_EDI;
  int i;
  secp256k1_int128 cg;
  secp256k1_int128 cf;
  int64_t gi;
  int64_t fi;
  int64_t r;
  int64_t q;
  int64_t v;
  int64_t u;
  uint64_t M62;
  uint in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar3;
  int64_t in_stack_ffffffffffffff90;
  int64_t in_stack_ffffffffffffff98;
  secp256k1_int128 *in_stack_ffffffffffffffa0;
  
  iVar2 = in_RCX[2];
  if (in_EDI < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
            ,0x22f,"test condition failed: len > 0");
    abort();
  }
  b = *in_RSI;
  secp256k1_i128_mul((secp256k1_int128 *)&stack0xffffffffffffff98,*in_RCX,b);
  secp256k1_i128_accum_mul
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  secp256k1_i128_mul((secp256k1_int128 *)&stack0xffffffffffffff88,iVar2,b);
  secp256k1_i128_accum_mul
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  uVar1 = secp256k1_i128_to_u64((secp256k1_int128 *)&stack0xffffffffffffff98);
  if ((uVar1 & 0x3fffffffffffffff) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
            ,0x238,"test condition failed: (secp256k1_i128_to_u64(&cf) & M62) == 0");
    abort();
  }
  secp256k1_i128_rshift
            ((secp256k1_int128 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff7c);
  uVar1 = secp256k1_i128_to_u64((secp256k1_int128 *)&stack0xffffffffffffff88);
  if ((uVar1 & 0x3fffffffffffffff) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
            ,0x239,"test condition failed: (secp256k1_i128_to_u64(&cg) & M62) == 0");
    abort();
  }
  secp256k1_i128_rshift
            ((secp256k1_int128 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff7c);
  for (iVar3 = 1; iVar3 < in_EDI; iVar3 = iVar3 + 1) {
    secp256k1_i128_accum_mul
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    secp256k1_i128_accum_mul
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    secp256k1_i128_accum_mul
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    secp256k1_i128_accum_mul
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    uVar1 = secp256k1_i128_to_u64((secp256k1_int128 *)&stack0xffffffffffffff98);
    in_RSI[iVar3 + -1] = uVar1 & 0x3fffffffffffffff;
    secp256k1_i128_rshift
              ((secp256k1_int128 *)CONCAT44(iVar3,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c);
    uVar1 = secp256k1_i128_to_u64((secp256k1_int128 *)&stack0xffffffffffffff88);
    *(uint64_t *)(in_RDX + (long)(iVar3 + -1) * 8) = uVar1 & 0x3fffffffffffffff;
    secp256k1_i128_rshift
              ((secp256k1_int128 *)CONCAT44(iVar3,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c);
  }
  iVar2 = secp256k1_i128_to_i64((secp256k1_int128 *)CONCAT44(iVar3,in_stack_ffffffffffffff80));
  in_RSI[in_EDI + -1] = iVar2;
  iVar2 = secp256k1_i128_to_i64((secp256k1_int128 *)CONCAT44(iVar3,in_stack_ffffffffffffff80));
  *(int64_t *)(in_RDX + (long)(in_EDI + -1) * 8) = iVar2;
  return;
}

Assistant:

static void secp256k1_modinv64_update_fg_62_var(int len, secp256k1_modinv64_signed62 *f, secp256k1_modinv64_signed62 *g, const secp256k1_modinv64_trans2x2 *t) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const int64_t u = t->u, v = t->v, q = t->q, r = t->r;
    int64_t fi, gi;
    secp256k1_int128 cf, cg;
    int i;
    VERIFY_CHECK(len > 0);
    /* Start computing t*[f,g]. */
    fi = f->v[0];
    gi = g->v[0];
    secp256k1_i128_mul(&cf, u, fi);
    secp256k1_i128_accum_mul(&cf, v, gi);
    secp256k1_i128_mul(&cg, q, fi);
    secp256k1_i128_accum_mul(&cg, r, gi);
    /* Verify that the bottom 62 bits of the result are zero, and then throw them away. */
    VERIFY_CHECK((secp256k1_i128_to_u64(&cf) & M62) == 0); secp256k1_i128_rshift(&cf, 62);
    VERIFY_CHECK((secp256k1_i128_to_u64(&cg) & M62) == 0); secp256k1_i128_rshift(&cg, 62);
    /* Now iteratively compute limb i=1..len of t*[f,g], and store them in output limb i-1 (shifting
     * down by 62 bits). */
    for (i = 1; i < len; ++i) {
        fi = f->v[i];
        gi = g->v[i];
        secp256k1_i128_accum_mul(&cf, u, fi);
        secp256k1_i128_accum_mul(&cf, v, gi);
        secp256k1_i128_accum_mul(&cg, q, fi);
        secp256k1_i128_accum_mul(&cg, r, gi);
        f->v[i - 1] = secp256k1_i128_to_u64(&cf) & M62; secp256k1_i128_rshift(&cf, 62);
        g->v[i - 1] = secp256k1_i128_to_u64(&cg) & M62; secp256k1_i128_rshift(&cg, 62);
    }
    /* What remains is limb (len) of t*[f,g]; store it as output limb (len-1). */
    f->v[len - 1] = secp256k1_i128_to_i64(&cf);
    g->v[len - 1] = secp256k1_i128_to_i64(&cg);
}